

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

int __thiscall
CConsole::PossibleMaps(CConsole *this,char *pStr,FPossibleCallback pfnCallback,void *pUser)

{
  CMapListEntryTemp *pCVar1;
  char *pcVar2;
  int iVar3;
  CMapListEntryTemp **ppCVar4;
  
  ppCVar4 = &this->m_pFirstMapEntry;
  iVar3 = 0;
  while( true ) {
    pCVar1 = *ppCVar4;
    if (pCVar1 == (CMapListEntryTemp *)0x0) break;
    pcVar2 = str_find_nocase(pCVar1->m_aName,pStr);
    if (pcVar2 != (char *)0x0) {
      (*pfnCallback)(iVar3,pCVar1->m_aName,pUser);
      iVar3 = iVar3 + 1;
    }
    ppCVar4 = &pCVar1->m_pNext;
  }
  return iVar3;
}

Assistant:

int CConsole::PossibleMaps(const char *pStr, FPossibleCallback pfnCallback, void *pUser)
{
	int Index = 0;
	for(CMapListEntryTemp *pMapEntry = m_pFirstMapEntry; pMapEntry; pMapEntry = pMapEntry->m_pNext)
	{
		if(str_find_nocase(pMapEntry->m_aName, pStr))
		{
			pfnCallback(Index, pMapEntry->m_aName, pUser);
			Index++;
		}
	}
	return Index;
}